

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void opengv::absolute_pose::modules::p3p_kneip_main
               (bearingVectors_t *f,points_t *p,transformations_t *solutions)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  reference pvVar3;
  Scalar *pSVar4;
  TransposeReturnType other;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RDI;
  RealScalar RVar5;
  __type _Var6;
  double dVar7;
  double dVar8;
  double dVar9;
  Scalar SVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  PVar67;
  transformation_t solution;
  rotation_t R;
  translation_t C;
  double cos_alpha;
  double sin_alpha;
  double sin_theta;
  double cos_theta;
  double cot_alpha;
  int i;
  vector<double,_std::allocator<double>_> realRoots;
  Matrix<double,_5,_1,_0,_5,_1> factors;
  double b_pw2;
  double d_12_pw2;
  double p_2_pw4;
  double p_2_pw3;
  double p_2_pw2;
  double p_1_pw4;
  double p_1_pw3;
  double p_1_pw2;
  double f_2_pw2;
  double f_1_pw2;
  double b;
  double cos_beta;
  double p_2;
  double p_1;
  double f_2;
  double f_1;
  double d_12;
  rotation_t N;
  Vector3d n2;
  Vector3d n3;
  Vector3d n1;
  rotation_t T;
  Vector3d e2;
  Vector3d e3;
  Vector3d e1;
  bearingVector_t f3;
  bearingVector_t f2;
  bearingVector_t f1;
  Vector3d temp2;
  Vector3d temp1;
  point_t P3;
  point_t P2;
  point_t P1;
  RhsNested in_stack_fffffffffffff600;
  LhsNested in_stack_fffffffffffff608;
  Index in_stack_fffffffffffff610;
  TransposeReturnType in_stack_fffffffffffff618;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffff620;
  double dVar68;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff628;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff630;
  double *in_stack_fffffffffffff648;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff650;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff698;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff6a0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffff6a8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff6b0;
  double local_6d8;
  int local_6b0;
  vector<double,_std::allocator<double>_> local_688 [2];
  __type local_648;
  __type local_640;
  double local_638;
  double local_630;
  __type local_628;
  double local_620;
  double local_618;
  __type local_610;
  __type local_608;
  __type local_600;
  double local_5f8;
  double local_5f0;
  Scalar local_5e8;
  Scalar local_5e0;
  double local_5d8;
  double local_5d0;
  RealScalar local_5c8;
  non_const_type local_558;
  non_const_type local_520;
  non_const_type local_4e8;
  RealScalar local_480;
  RealScalar local_428;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_3d0;
  non_const_type local_390;
  non_const_type local_358;
  non_const_type local_320;
  RealScalar local_300;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_2c0;
  non_const_type local_280;
  non_const_type local_248;
  non_const_type local_210;
  MatrixXd *in_stack_fffffffffffffe20;
  
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](in_RSI,0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](in_RSI,1);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::operator[](in_RSI,2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
             (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff600.m_matrix);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff600.m_matrix);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
            (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
  RVar5 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                     in_stack_fffffffffffff600.m_matrix);
  if ((RVar5 != 0.0) || (NAN(RVar5))) {
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RDI,0);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RDI,1);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_RDI,2);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x7f67f4);
    local_210 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
               in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff600.m_matrix);
    local_248 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
               in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff600.m_matrix);
    local_280 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
               in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff600.m_matrix);
    local_2c0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           in_stack_fffffffffffff608.m_matrix,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_fffffffffffff600.m_matrix);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f690f);
    if (0.0 < *pSVar1) {
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](in_RDI,1);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](in_RDI,0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](in_RDI,2);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      local_300 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                             in_stack_fffffffffffff600.m_matrix);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_fffffffffffff600.m_matrix);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
                (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      local_320 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                             in_stack_fffffffffffff600.m_matrix);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
                 in_stack_fffffffffffff608.m_matrix,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                 in_stack_fffffffffffff600.m_matrix);
      local_358 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                             in_stack_fffffffffffff600.m_matrix);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
                 in_stack_fffffffffffff608.m_matrix,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                 in_stack_fffffffffffff600.m_matrix);
      local_390 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                             in_stack_fffffffffffff600.m_matrix);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                 in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
      Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
                 in_stack_fffffffffffff608.m_matrix,
                 (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                 in_stack_fffffffffffff600.m_matrix);
      local_3d0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             in_stack_fffffffffffff608.m_matrix,
                             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                             in_stack_fffffffffffff600.m_matrix);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_fffffffffffff600.m_matrix);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](in_RSI,1);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](in_RSI,0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[](in_RSI,2);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff600.m_matrix);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff600.m_matrix);
    local_428 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
    cross<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8);
    local_480 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (in_stack_fffffffffffff650,in_stack_fffffffffffff648);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x7f6cd7);
    local_4e8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
               in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff600.m_matrix);
    local_520 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
               in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff600.m_matrix);
    local_558 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               in_stack_fffffffffffff618.m_matrix,in_stack_fffffffffffff610);
    Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false> *)
               in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff600.m_matrix);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              (in_stack_fffffffffffff620,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff618.m_matrix);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff608.m_matrix,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffff600.m_matrix);
    local_5c8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f6e1b);
    dVar68 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f6e3e);
    local_5d0 = dVar68 / *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f6e6a);
    dVar68 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f6e8d);
    local_5d8 = dVar68 / *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f6eb7);
    local_5e0 = *pSVar1;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f6eda);
    local_5e8 = *pSVar1;
    local_5f0 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                dot<Eigen::Matrix<double,3,1,0,3,1>>
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff608.m_matrix,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff600.m_matrix);
    _Var6 = std::pow<double,int>
                      ((double)in_stack_fffffffffffff608.m_matrix,
                       (int)((ulong)in_stack_fffffffffffff600.m_matrix >> 0x20));
    local_5f8 = 1.0 / (1.0 - _Var6) - 1.0;
    if (0.0 <= local_5f0) {
      local_5f8 = sqrt(local_5f8);
    }
    else {
      local_5f8 = sqrt(local_5f8);
      local_5f8 = -local_5f8;
    }
    local_600 = std::pow<double,int>
                          ((double)in_stack_fffffffffffff608.m_matrix,
                           (int)((ulong)in_stack_fffffffffffff600.m_matrix >> 0x20));
    local_608 = std::pow<double,int>
                          ((double)in_stack_fffffffffffff608.m_matrix,
                           (int)((ulong)in_stack_fffffffffffff600.m_matrix >> 0x20));
    local_610 = std::pow<double,int>
                          ((double)in_stack_fffffffffffff608.m_matrix,
                           (int)((ulong)in_stack_fffffffffffff600.m_matrix >> 0x20));
    local_618 = local_610 * local_5e0;
    local_620 = local_618 * local_5e0;
    local_628 = std::pow<double,int>
                          ((double)in_stack_fffffffffffff608.m_matrix,
                           (int)((ulong)in_stack_fffffffffffff600.m_matrix >> 0x20));
    local_630 = local_628 * local_5e8;
    local_638 = local_630 * local_5e8;
    local_640 = std::pow<double,int>
                          ((double)in_stack_fffffffffffff608.m_matrix,
                           (int)((ulong)in_stack_fffffffffffff600.m_matrix >> 0x20));
    local_648 = std::pow<double,int>
                          ((double)in_stack_fffffffffffff608.m_matrix,
                           (int)((ulong)in_stack_fffffffffffff600.m_matrix >> 0x20));
    Eigen::Matrix<double,_5,_1,_0,_5,_1>::Matrix((Matrix<double,_5,_1,_0,_5,_1> *)0x7f70e9);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_608;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_638;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_638 * local_600;
    auVar18 = vfnmsub213sd_fma(auVar18,auVar32,auVar42);
    dVar68 = auVar18._0_8_ - local_638;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f713a);
    *pSVar2 = dVar68;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_5c8;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_5f8;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = (local_630 + local_630) * local_5c8;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = (local_608 + local_608) * local_630 * local_5c8 * local_5f8;
    auVar18 = vfmadd213sd_fma(auVar33,auVar19,auVar49);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (local_5d8 + local_5d8) * local_630 * local_5d0;
    auVar18 = vfnmadd213sd_fma(auVar11,auVar20,auVar18);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f71ce);
    *pSVar2 = auVar18._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_608;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_628;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_610;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_640;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_648;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_608 * local_628;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_608 * local_628 * local_640 * local_648;
    auVar18 = vfnmsub213sd_fma(auVar21,auVar50,auVar57);
    auVar18 = vfnmadd213sd_fma(auVar43,auVar50,auVar18);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_638;
    auVar18 = vfmadd213sd_fma(auVar51,auVar60,auVar18);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_600;
    auVar18 = vfmadd213sd_fma(auVar58,auVar51,auVar18);
    dVar68 = (local_5e0 + local_5e0) * local_628;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_5c8;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar68;
    auVar18 = vfmadd213sd_fma(auVar52,auVar54,auVar18);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_5f8;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = (local_5d0 + local_5d0) * local_5d8 * local_5e0 * local_628 * local_5c8;
    auVar18 = vfmadd213sd_fma(auVar65,auVar62,auVar18);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_628 * local_610;
    auVar18 = vfnmadd213sd_fma(auVar58,auVar63,auVar18);
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar68 * local_608;
    auVar18 = vfmadd213sd_fma(auVar52,auVar55,auVar18);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_628 * local_640;
    auVar18 = vfnmadd213sd_fma(auVar34,auVar44,auVar18);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_610 + local_610;
    auVar18 = vfnmadd213sd_fma(auVar12,auVar22,auVar18);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f72ec);
    *pSVar2 = auVar18._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_5f8;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (local_610 + local_610) * local_5e8 * local_5c8;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = (local_5d8 + local_5d8) * local_630 * local_5d0 * local_5c8;
    auVar18 = vfmadd213sd_fma(auVar13,auVar23,auVar59);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = (local_608 + local_608) * local_630 * local_5c8;
    auVar18 = vfnmadd213sd_fma(auVar13,auVar24,auVar18);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = (local_5e0 + local_5e0) * local_5e8 * local_640;
    auVar18 = vfnmadd213sd_fma(auVar13,auVar25,auVar18);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f73c1);
    *pSVar2 = auVar18._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_5c8;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_5f8;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_640;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_640 * local_608 * local_628;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_5d8 * -2.0 * local_628 * local_5d0 * local_5e0 * local_5c8;
    auVar18 = vfmadd213sd_fma(auVar66,auVar35,auVar26);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_618 + local_618;
    auVar18 = vfmadd213sd_fma(auVar45,auVar36,auVar18);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_610;
    auVar18 = vfnmadd213sd_fma(auVar64,auVar37,auVar18);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_608 * local_628;
    auVar18 = vfmadd213sd_fma(auVar37,auVar61,auVar18);
    auVar53._8_8_ = 0;
    auVar53._0_8_ = (local_608 + local_608) * local_628 * local_5e0;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auVar18._0_8_ - local_620;
    auVar18 = vfnmadd213sd_fma(auVar45,auVar53,auVar56);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_628 * local_600;
    auVar18 = vfmadd213sd_fma(auVar37,auVar14,auVar18);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_648;
    auVar18 = vfmadd213sd_fma(auVar15,auVar26,auVar18);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_1> *)
                        in_stack_fffffffffffff608.m_matrix,(Index)in_stack_fffffffffffff600.m_matrix
                        ,0x7f74cd);
    *pSVar2 = auVar18._0_8_;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,5,1,0,5,1>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff608.m_matrix,
               (EigenBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)
               in_stack_fffffffffffff600.m_matrix);
    math::o4_roots(in_stack_fffffffffffffe20);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x7f751b)
    ;
    PVar67.m_rhs.m_matrix = in_stack_fffffffffffff600.m_matrix;
    PVar67.m_lhs.m_matrix = in_stack_fffffffffffff608.m_matrix;
    for (local_6b0 = 0; local_6b0 < 4; local_6b0 = local_6b0 + 1) {
      dVar7 = (local_5d0 * local_5e0) / local_5d8;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_688,(long)local_6b0);
      dVar68 = local_5d0;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar7;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *pvVar3;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_5e8;
      auVar18 = vfnmsub213sd_fma(auVar38,auVar16,auVar27);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_5c8;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_5f8;
      auVar18 = vfmadd213sd_fma(auVar17,auVar28,auVar18);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_688,(long)local_6b0);
      dVar7 = (local_5e0 - (dVar68 * *pvVar3 * local_5e8) / local_5d8) - local_5c8;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_688,(long)local_6b0);
      dVar68 = *pvVar3;
      std::vector<double,_std::allocator<double>_>::operator[](local_688,(long)local_6b0);
      _Var6 = std::pow<double,int>
                        ((double)PVar67.m_lhs.m_matrix.m_matrix,PVar67.m_rhs.m_matrix._4_4_);
      dVar8 = sqrt(1.0 - _Var6);
      _Var6 = std::pow<double,int>
                        ((double)PVar67.m_lhs.m_matrix.m_matrix,PVar67.m_rhs.m_matrix._4_4_);
      dVar9 = sqrt(1.0 / (_Var6 + 1.0));
      _Var6 = std::pow<double,int>
                        ((double)PVar67.m_lhs.m_matrix.m_matrix,PVar67.m_rhs.m_matrix._4_4_);
      local_6d8 = sqrt(1.0 - _Var6);
      if (auVar18._0_8_ / dVar7 < 0.0) {
        local_6d8 = -local_6d8;
      }
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x7f77c6);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_6d8;
      dVar7 = local_5c8 * local_6d8;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = dVar9;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_5f8;
      auVar18 = vfmadd213sd_fma(auVar29,auVar39,auVar46);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7816);
      *pSVar1 = dVar7 * auVar18._0_8_;
      dVar7 = dVar68 * local_5c8;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = dVar9;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_5f8;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_6d8;
      auVar18 = vfmadd213sd_fma(auVar30,auVar40,auVar47);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7892);
      *pSVar1 = dVar7 * dVar9 * auVar18._0_8_;
      dVar7 = dVar8 * local_5c8;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar9;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_5f8;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_6d8;
      auVar18 = vfmadd213sd_fma(auVar31,auVar41,auVar48);
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f790e);
      *pSVar1 = dVar7 * dVar9 * auVar18._0_8_;
      Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)PVar67.m_rhs.m_matrix.m_matrix)
      ;
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                 PVar67.m_lhs.m_matrix.m_matrix,
                 (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar67.m_rhs.m_matrix.m_matrix
                );
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                (in_stack_fffffffffffff630,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)in_stack_fffffffffffff628);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)PVar67.m_lhs.m_matrix.m_matrix,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                  *)PVar67.m_rhs.m_matrix.m_matrix);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x7f79de);
      SVar10 = -local_6d8;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7a13);
      *pSVar4 = SVar10;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7a74);
      *pSVar4 = -dVar9 * dVar68;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7ad2);
      *pSVar4 = -dVar9 * dVar8;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7b13);
      *pSVar4 = dVar9;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7b67);
      *pSVar4 = -local_6d8 * dVar68;
      dVar7 = -local_6d8 * dVar8;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7bbd);
      *pSVar4 = dVar7;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7be9);
      *pSVar4 = 0.0;
      in_stack_fffffffffffff630 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)((ulong)dVar8 ^ 0x8000000000000000);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                          PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,
                          0x7f7c2f);
      *pSVar4 = (Scalar)in_stack_fffffffffffff630;
      in_stack_fffffffffffff628 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      PVar67.m_lhs.m_matrix.m_matrix,(Index)PVar67.m_rhs.m_matrix.m_matrix,0x7f7c69)
      ;
      *(double *)in_stack_fffffffffffff628 = dVar68;
      in_stack_fffffffffffff618 =
           Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                     ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                      PVar67.m_rhs.m_matrix.m_matrix);
      other = Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         PVar67.m_rhs.m_matrix.m_matrix);
      PVar67 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                          PVar67.m_lhs.m_matrix.m_matrix,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                          PVar67.m_rhs.m_matrix.m_matrix);
      Eigen::
      MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
      ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>
                   *)in_stack_fffffffffffff618.m_matrix,
                  (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)other.m_matrix);
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                (PVar67.m_lhs.m_matrix.m_matrix,
                 (DenseBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)PVar67.m_rhs.m_matrix.m_matrix);
      Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x7f7d3d);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_fffffffffffff618.m_matrix,(Index)other.m_matrix);
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)
                 PVar67.m_lhs.m_matrix.m_matrix,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)PVar67.m_rhs.m_matrix.m_matrix)
      ;
      Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
                ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                 in_stack_fffffffffffff618.m_matrix,(Index)other.m_matrix,
                 (Index)PVar67.m_lhs.m_matrix.m_matrix);
      Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
                ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)
                 PVar67.m_lhs.m_matrix.m_matrix,
                 (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)PVar67.m_rhs.m_matrix.m_matrix)
      ;
      std::
      vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
                   *)in_stack_fffffffffffff618.m_matrix,(value_type *)other.m_matrix);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff618.m_matrix);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::p3p_kneip_main(
    const bearingVectors_t & f,
    const points_t & p,
    transformations_t & solutions )
{
  point_t P1 = p[0];
  point_t P2 = p[1];
  point_t P3 = p[2];

  Eigen::Vector3d temp1 = P2 - P1;
  Eigen::Vector3d temp2 = P3 - P1;

  if( temp1.cross(temp2).norm() == 0)
    return;

  bearingVector_t f1 = f[0];
  bearingVector_t f2 = f[1];
  bearingVector_t f3 = f[2];

  Eigen::Vector3d e1 = f1;
  Eigen::Vector3d e3 = f1.cross(f2);
  e3 = e3/e3.norm();
  Eigen::Vector3d e2 = e3.cross(e1);

  rotation_t T;
  T.row(0) = e1.transpose();
  T.row(1) = e2.transpose();
  T.row(2) = e3.transpose();

  f3 = T*f3;

  if( f3(2,0) > 0)
  {
    f1 = f[1];
    f2 = f[0];
    f3 = f[2];

    e1 = f1;
    e3 = f1.cross(f2);
    e3 = e3/e3.norm();
    e2 = e3.cross(e1);

    T.row(0) = e1.transpose();
    T.row(1) = e2.transpose();
    T.row(2) = e3.transpose();

    f3 = T*f3;

    P1 = p[1];
    P2 = p[0];
    P3 = p[2];
  }

  Eigen::Vector3d n1 = P2-P1;
  n1 = n1/n1.norm();
  Eigen::Vector3d n3 = n1.cross(P3-P1);
  n3 = n3/n3.norm();
  Eigen::Vector3d n2 = n3.cross(n1);

  rotation_t N;
  N.row(0) = n1.transpose();
  N.row(1) = n2.transpose();
  N.row(2) = n3.transpose();

  P3 = N*(P3-P1);

  double d_12 = temp1.norm();
  double f_1 = f3(0,0)/f3(2,0);
  double f_2 = f3(1,0)/f3(2,0);
  double p_1 = P3(0,0);
  double p_2 = P3(1,0);

  double cos_beta = f1.dot(f2);
  double b = 1/( 1 - pow( cos_beta, 2 ) ) - 1;

  if( cos_beta < 0 )
    b = -sqrt(b);
  else
    b = sqrt(b);

  double f_1_pw2 = pow(f_1,2);
  double f_2_pw2 = pow(f_2,2);
  double p_1_pw2 = pow(p_1,2);
  double p_1_pw3 = p_1_pw2 * p_1;
  double p_1_pw4 = p_1_pw3 * p_1;
  double p_2_pw2 = pow(p_2,2);
  double p_2_pw3 = p_2_pw2 * p_2;
  double p_2_pw4 = p_2_pw3 * p_2;
  double d_12_pw2 = pow(d_12,2);
  double b_pw2 = pow(b,2);

  Eigen::Matrix<double,5,1> factors;

  factors(0,0) = -f_2_pw2*p_2_pw4
                 -p_2_pw4*f_1_pw2
                 -p_2_pw4;

  factors(1,0) = 2*p_2_pw3*d_12*b
                 +2*f_2_pw2*p_2_pw3*d_12*b
                 -2*f_2*p_2_pw3*f_1*d_12;

  factors(2,0) = -f_2_pw2*p_2_pw2*p_1_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2*b_pw2
                 -f_2_pw2*p_2_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw4
                 +p_2_pw4*f_1_pw2
                 +2*p_1*p_2_pw2*d_12
                 +2*f_1*f_2*p_1*p_2_pw2*d_12*b
                 -p_2_pw2*p_1_pw2*f_1_pw2
                 +2*p_1*p_2_pw2*f_2_pw2*d_12
                 -p_2_pw2*d_12_pw2*b_pw2
                 -2*p_1_pw2*p_2_pw2;

  factors(3,0) = 2*p_1_pw2*p_2*d_12*b
                 +2*f_2*p_2_pw3*f_1*d_12
                 -2*f_2_pw2*p_2_pw3*d_12*b
                 -2*p_1*p_2*d_12_pw2*b;

  factors(4,0) = -2*f_2*p_2_pw2*f_1*p_1*d_12*b
                 +f_2_pw2*p_2_pw2*d_12_pw2
                 +2*p_1_pw3*d_12
                 -p_1_pw2*d_12_pw2
                 +f_2_pw2*p_2_pw2*p_1_pw2
                 -p_1_pw4
                 -2*f_2_pw2*p_2_pw2*p_1*d_12
                 +p_2_pw2*f_1_pw2*p_1_pw2
                 +f_2_pw2*p_2_pw2*d_12_pw2*b_pw2;

  std::vector<double> realRoots = math::o4_roots(factors);

  for( int i = 0; i < 4; i++ )
  {
    double cot_alpha =
        (-f_1*p_1/f_2-realRoots[i]*p_2+d_12*b)/
        (-f_1*realRoots[i]*p_2/f_2+p_1-d_12);

    double cos_theta = realRoots[i];
    double sin_theta = sqrt(1-pow(realRoots[i],2));
    double sin_alpha = sqrt(1/(pow(cot_alpha,2)+1));
    double cos_alpha = sqrt(1-pow(sin_alpha,2));

    if (cot_alpha < 0)
      cos_alpha = -cos_alpha;

    translation_t C;
    C(0,0) = d_12*cos_alpha*(sin_alpha*b+cos_alpha);
    C(1,0) = cos_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);
    C(2,0) = sin_theta*d_12*sin_alpha*(sin_alpha*b+cos_alpha);

    C = P1 + N.transpose()*C;

    rotation_t R;
    R(0,0) = -cos_alpha;
    R(0,1) = -sin_alpha*cos_theta;
    R(0,2) = -sin_alpha*sin_theta;
    R(1,0) = sin_alpha;
    R(1,1) = -cos_alpha*cos_theta;
    R(1,2) = -cos_alpha*sin_theta;
    R(2,0) = 0.0;
    R(2,1) = -sin_theta;
    R(2,2) = cos_theta;

    R = N.transpose()*R.transpose()*T;

    transformation_t solution;
    solution.col(3) = C;
    solution.block<3,3>(0,0) = R;

    solutions.push_back(solution);
  }
}